

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_invalidMathmlCellMLNsOnNode_Test::TestBody
          (Validator_invalidMathmlCellMLNsOnNode_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  shared_ptr<libcellml::Logger> local_188;
  ScopedTrace local_171;
  undefined1 local_170 [7];
  ScopedTrace gtest_trace_881;
  ComponentPtr c;
  ModelPtr m;
  ValidatorPtr v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  allocator<char> local_31;
  string local_30 [8];
  string math;
  Validator_invalidMathmlCellMLNsOnNode_Test *this_local;
  
  math.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<math  xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply><cellml:bvar><ci cellml:units=\"dimensionless\">B</ci></cellml:bvar></apply></math>"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_1_ = 1
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,
             "Model \'\' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters."
             ,(allocator<char> *)
              ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,
             "Component \'\' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters."
             ,(allocator<char> *)
              ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"Math has a \'bvar\' element that is not a supported MathML element.",
             (allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,
             "MathML ci element has the child text \'B\' which does not correspond with any variable names present in component \'\'."
             ,(allocator<char> *)
              ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"W3C MathML DTD error: No declaration for attribute units of element ci.",
             (allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"Math has a \'bvar\' element without exactly two MathML siblings.",
             (allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 2));
  v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_1_ = 0
  ;
  local_70 = &local_130;
  local_68 = 6;
  this_00 = &v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,__l,(allocator_type *)this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70;
  do {
    local_200 = local_200 + -1;
    std::__cxx11::string::~string((string *)local_200);
  } while (local_200 != &local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 2));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Validator::create();
  libcellml::Model::create();
  libcellml::Component::create();
  peVar1 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_170);
  libcellml::Component::setMath((string *)peVar1);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar2);
  peVar3 = std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Validator::validateModel((shared_ptr *)peVar3);
  testing::ScopedTrace::ScopedTrace
            (&local_171,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/validator/validator.cpp"
             ,0x371,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Validator,void>
            (&local_188,
             (shared_ptr<libcellml::Validator> *)
             &m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expectEqualIssues((vector *)local_60,(shared_ptr *)&local_188);
  std::shared_ptr<libcellml::Logger>::~shared_ptr(&local_188);
  testing::ScopedTrace::~ScopedTrace(&local_171);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_170);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Validator>::~shared_ptr
            ((shared_ptr<libcellml::Validator> *)
             &m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Validator, invalidMathmlCellMLNsOnNode)
{
    const std::string math =
        "<math  xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply><cellml:bvar><ci cellml:units=\"dimensionless\">B</ci></cellml:bvar></apply></math>";
    const std::vector<std::string> expectedIssues = {
        "Model '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Component '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Math has a 'bvar' element that is not a supported MathML element.",
        "MathML ci element has the child text 'B' which does not correspond with any variable names present in component ''.",
        "W3C MathML DTD error: No declaration for attribute units of element ci.",
        "Math has a 'bvar' element without exactly two MathML siblings.",
    };
    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();

    c->setMath(math);
    m->addComponent(c);

    v->validateModel(m);
    EXPECT_EQ_ISSUES(expectedIssues, v);
}